

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

int on_message_complete(http_parser *parser)

{
  cio_error cVar1;
  uint64_t *client_00;
  int local_28;
  cio_http_cb_return ret;
  cio_error err;
  cio_http_client *client;
  http_parser *parser_local;
  
  client_00 = &parser[-0x1b].content_length;
  if (-1 < *(int *)&parser->field_0x14) {
    cVar1 = cio_timer_cancel((cio_timer *)&parser[-7].data);
    if (cVar1 != CIO_SUCCESS) {
      handle_server_error((cio_http_client *)client_00,
                          "Cancelling read timer in on_message_complete failed, maybe not armed?");
      return 0;
    }
    *(code **)&parser[-2].http_major = restart_read_request;
  }
  local_28 = 0;
  if (((parser[-2].content_length & 1) == 0) && (*(long *)((long)parser[-0x14].data + 0x58) != 0)) {
    local_28 = (**(code **)((long)parser[-0x14].data + 0x58))(client_00);
  }
  if (((*(byte *)((long)&parser[-2].content_length + 2) ^ 0xff) & 1) == 0) {
    *(undefined1 *)((long)&parser[-2].content_length + 1) = 1;
    parser_local._4_4_ = local_28;
  }
  else {
    handle_server_error((cio_http_client *)client_00,
                        "After receiving the complete message, no response was written!");
    parser_local._4_4_ = 0;
  }
  return parser_local._4_4_;
}

Assistant:

static int on_message_complete(http_parser *parser)
{
	struct cio_http_client *client = cio_container_of(parser, struct cio_http_client, parser);

	if (cio_unlikely(!client->parser.upgrade)) {
		enum cio_error err = cio_timer_cancel(&client->http_private.request_timer);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_server_error(client, "Cancelling read timer in on_message_complete failed, maybe not armed?");
			return 0;
		}

		client->http_private.finish_func = restart_read_request;
	}

	enum cio_http_cb_return ret = CIO_HTTP_CB_SUCCESS;
	if ((!client->http_private.response_fired) && client->current_handler->on_message_complete) {
		ret = client->current_handler->on_message_complete(client);
	}

	if (cio_unlikely(!client->http_private.response_written)) {
		handle_server_error(client, "After receiving the complete message, no response was written!");
		return CIO_HTTP_CB_SUCCESS;
	}

	client->http_private.request_complete = true;
	return ret;
}